

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O1

void __thiscall GLSectorStackPortal::DrawContents(GLSectorStackPortal *this)

{
  FPortal *pFVar1;
  double dVar2;
  double dVar3;
  FGLRenderer *this_00;
  subsector_t *psVar4;
  long lVar5;
  DAngle local_28;
  
  this_00 = GLRenderer;
  pFVar1 = this->origin;
  dVar2 = ViewPos.X + (pFVar1->mDisplacement).X;
  dVar3 = ViewPos.Y + (pFVar1->mDisplacement).Y;
  ViewPos.X = dVar2;
  ViewPos.Y = dVar3;
  GLRenderer->mViewActor = (AActor *)0x0;
  if ((long)pFVar1->plane != -1) {
    GLPortal::instack[pFVar1->plane] = GLPortal::instack[pFVar1->plane] + 1;
  }
  local_28.Degrees = ViewAngle.Degrees;
  FGLRenderer::SetupView
            (this_00,(float)dVar2,(float)dVar3,(float)ViewPos.Z,&local_28,
             (bool)((byte)GLPortal::MirrorFlag & 1),(bool)((byte)GLPortal::PlaneMirrorFlag & 1));
  TArray<unsigned_char,_unsigned_char>::Resize
            (&(this->super_GLPortal).savedmapsection,currentmapsection.Count);
  memcpy((this->super_GLPortal).savedmapsection.Array,currentmapsection.Array,
         (ulong)currentmapsection.Count);
  memset(currentmapsection.Array,0,(ulong)currentmapsection.Count);
  SetupCoverage(this);
  GLPortal::ClearClipper(&this->super_GLPortal);
  psVar4 = R_PointInSubsector(SUB84(ViewPos.X + 103079215104.0,0),
                              SUB84(ViewPos.Y + 103079215104.0,0));
  if (((gl_drawinfo->ss_renderflags).Array
       [((long)psVar4 - (long)subsectors >> 5) * -0x5555555555555555] & 0x10) == 0) {
    Clipper::AddClipRange(&clipper,0,0xffffffff);
    clipper.blocked = true;
  }
  FGLRenderer::DrawScene(GLRenderer,2);
  memcpy(currentmapsection.Array,(this->super_GLPortal).savedmapsection.Array,
         (ulong)currentmapsection.Count);
  lVar5 = (long)this->origin->plane;
  if (lVar5 != -1) {
    GLPortal::instack[lVar5] = GLPortal::instack[lVar5] + -1;
  }
  return;
}

Assistant:

void GLSectorStackPortal::DrawContents()
{
	FPortal *portal = origin;

	ViewPos += origin->mDisplacement;
	GLRenderer->mViewActor = NULL;

	// avoid recursions!
	if (origin->plane != -1) instack[origin->plane]++;

	GLRenderer->SetupView(ViewPos.X, ViewPos.Y, ViewPos.Z, ViewAngle, !!(MirrorFlag&1), !!(PlaneMirrorFlag&1));
	SaveMapSection();
	SetupCoverage();
	ClearClipper();
	
	// If the viewpoint is not within the portal, we need to invalidate the entire clip area.
	// The portal will re-validate the necessary parts when its subsectors get traversed.
	subsector_t *sub = R_PointInSubsector(ViewPos);
	if (!(gl_drawinfo->ss_renderflags[sub - ::subsectors] & SSRF_SEEN))
	{
		clipper.SafeAddClipRange(0, ANGLE_MAX);
		clipper.SetBlocked(true);
	}

	GLRenderer->DrawScene(DM_PORTAL);
	RestoreMapSection();

	if (origin->plane != -1) instack[origin->plane]--;
}